

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  bool bVar1;
  CppType CVar2;
  EnumDescriptor *pEVar3;
  Descriptor *this_00;
  string *psVar4;
  string local_90;
  string local_70;
  string local_50;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  ExtensionGenerator *this_local;
  
  this->descriptor_ = descriptor;
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  std::__cxx11::string::string((string *)&this->type_traits_);
  Options::Options(&this->options_,local_20);
  bVar1 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->type_traits_,"Repeated");
  }
  CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
  if (CVar2 == CPPTYPE_ENUM) {
    std::__cxx11::string::append((char *)&this->type_traits_);
    psVar4 = &this->type_traits_;
    pEVar3 = FieldDescriptor::enum_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_50,(cxx *)pEVar3,(EnumDescriptor *)0x1,SUB81(psVar4,0));
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)&this->type_traits_);
    psVar4 = &this->type_traits_;
    pEVar3 = FieldDescriptor::enum_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_70,(cxx *)pEVar3,(EnumDescriptor *)0x1,SUB81(psVar4,0));
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  else if (CVar2 == CPPTYPE_STRING) {
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  else if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::append((char *)&this->type_traits_);
    psVar4 = &this->type_traits_;
    this_00 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_90,(cxx *)this_00,(Descriptor *)0x1,SUB81(psVar4,0));
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  else {
    std::__cxx11::string::append((char *)&this->type_traits_);
    CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
    PrimitiveTypeName(CVar2);
    std::__cxx11::string::append((char *)&this->type_traits_);
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options)
  : descriptor_(descriptor),
    options_(options) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
}